

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

share_forwarding * share_find_forwarding(ssh_sharing_connstate *cs,char *host,int port)

{
  share_forwarding *psVar1;
  share_forwarding *ret;
  share_forwarding dummyfwd;
  int port_local;
  char *host_local;
  ssh_sharing_connstate *cs_local;
  
  dummyfwd.rpf._4_4_ = port;
  ret = (share_forwarding *)dupstr(host);
  dummyfwd.host._0_4_ = dummyfwd.rpf._4_4_;
  psVar1 = (share_forwarding *)find234(cs->forwardings,&ret,(cmpfn234)0x0);
  safefree(ret);
  return psVar1;
}

Assistant:

static struct share_forwarding *share_find_forwarding
    (struct ssh_sharing_connstate *cs, const char *host, int port)
{
    struct share_forwarding dummyfwd, *ret;
    dummyfwd.host = dupstr(host);
    dummyfwd.port = port;
    ret = find234(cs->forwardings, &dummyfwd, NULL);
    sfree(dummyfwd.host);
    return ret;
}